

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O3

bool_t hexEq(void *buf,char *hex)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  byte bVar4;
  
  sVar2 = strLen(hex);
  if (sVar2 == 0) {
    uVar1 = 1;
  }
  else {
    sVar3 = 0;
    bVar4 = 0;
    do {
      bVar4 = bVar4 | (hex_dec_table[(byte)hex[sVar3]] << 4 | hex_dec_table[(byte)hex[sVar3 + 1]]) ^
                      *buf;
      buf = (void *)((long)buf + 1);
      sVar3 = sVar3 + 2;
    } while (sVar2 != sVar3);
    uVar1 = (uint)(bVar4 == 0);
  }
  return uVar1;
}

Assistant:

bool_t SAFE(hexEq)(const void* buf, const char* hex)
{
	register word diff = 0;
	size_t count;
	ASSERT(hexIsValid(hex));
	ASSERT(memIsValid(buf, strLen(hex) / 2));
	count = strLen(hex);
	for (; count; count -= 2, hex += 2, buf = (const octet*)buf + 1)
		diff |= *(const octet*)buf ^ hexToO(hex);
	return wordEq(diff, 0);
}